

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovProgram.cpp
# Opt level: O2

cl_program
cov::createProgramWithSource
          (cl_context context,cl_uint count,char **strings,size_t *lengths,cl_int *errcodeRet)

{
  cl_int cVar1;
  Program *this;
  size_t i;
  ulong uVar2;
  long lVar3;
  allocator<char> local_79;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&sources,(ulong)count,(allocator_type *)local_50);
  lVar3 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)sources.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)sources.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
    if (lengths == (size_t *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_50,strings[uVar2],&local_79);
    }
    else {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,strings[uVar2],strings[uVar2] + lengths[uVar2]);
    }
    std::__cxx11::string::operator=
              ((string *)
               ((long)&((sources.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3),
               (string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    lVar3 = lVar3 + 0x20;
  }
  this = (Program *)operator_new(0x38,(nothrow_t *)&std::nothrow);
  if (this == (Program *)0x0) {
    cVar1 = -6;
  }
  else {
    Program::Program(this,(Context *)context,&sources);
    *(undefined4 *)&this[1].super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>.m_icdTable = 1;
    cVar1 = 0;
    if ((this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>).m_initSuccess != false)
    goto LAB_0010535e;
    Countable<cov::ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>_&>::release
              ((Countable<cov::ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>_&> *)this);
    cVar1 = -5;
  }
  this = (Program *)0x0;
LAB_0010535e:
  *errcodeRet = cVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&sources);
  return (cl_program)this;
}

Assistant:

cl_program createProgramWithSource(cl_context context,
                                   cl_uint count,
                                   const char** strings,
                                   const size_t* lengths,
                                   cl_int* errcodeRet)
{
    auto c = reinterpret_cast<Context*>(context);

    std::vector<std::string> sources(count);
    for (size_t i = 0; i < sources.size(); i++) {
        if (lengths) {
            sources[i] = std::string(strings[i], lengths[i]);
        } else {
            sources[i] = std::string(strings[i]);
        }
    }
    auto program = new(std::nothrow) Countable<Program>(*c, sources);
    if (!program) {
        *errcodeRet = CL_OUT_OF_HOST_MEMORY;
        return nullptr;
    }

    auto p = reinterpret_cast<Program*>(program);
    if (!p->initSuccess()) {
        p->release();
        *errcodeRet = CL_OUT_OF_RESOURCES;
        return nullptr;
    }

    *errcodeRet = CL_SUCCESS;
    return reinterpret_cast<_cl_program*>(p);
}